

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen8Texture.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmGen8TextureCalc::Fill2DTexOffsetAddress
          (GmmGen8TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  uint8_t uVar2;
  int iVar3;
  GMM_GFX_SIZE_T GVar4;
  undefined4 extraout_var;
  uint uVar5;
  ulong uVar6;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  uint32_t CompressHeight;
  
  if (((pTexInfo->ArraySize < 2) && (pTexInfo->Type != RESOURCE_CUBE)) &&
     (((ulong)(pTexInfo->Flags).Gpu & 0x18) == 0)) {
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = 0;
  }
  else {
    GmmTextureCalc::GetCompressionBlockDimensions
              ((GmmTextureCalc *)this,pTexInfo->Format,&local_2c,&CompressWidth,&local_28);
    uVar5 = (pTexInfo->Alignment).QPitch;
    uVar6 = (ulong)uVar5;
    uVar2 = GmmIsCompressed((this->super_GmmGen7TextureCalc).super_GmmTextureCalc.pGmmLibContext,
                            pTexInfo->Format);
    if (uVar2 == '\0') {
      aVar1 = (pTexInfo->Flags).Gpu;
      if ((aVar1._0_4_ >> 0x1d & 1) == 0) {
        if (((ulong)aVar1 & 2) != 0) {
          if (((ulong)aVar1 >> 0x29 & 1) == 0) {
            uVar6 = (ulong)(uVar5 >> ((byte)((ulong)aVar1 >> 0x26) & 4));
          }
          else {
            uVar6 = (ulong)(uVar5 >> 5);
          }
        }
      }
      else {
        uVar6 = (ulong)(uVar5 >> 1);
      }
    }
    else {
      uVar6 = uVar6 / CompressWidth;
    }
    GVar4 = uVar6 * pTexInfo->Pitch;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = GVar4;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = GVar4;
  }
  for (uVar5 = 0; uVar5 <= pTexInfo->MaxLod; uVar5 = uVar5 + 1) {
    iVar3 = (*(this->super_GmmGen7TextureCalc).super_GmmTextureCalc._vptr_GmmTextureCalc[8])
                      (this,pTexInfo,(ulong)uVar5);
    *(ulong *)(pTexInfo->MmcHint + (ulong)uVar5 * 8 + 0x80) = CONCAT44(extraout_var,iVar3);
  }
  return;
}

Assistant:

void GmmLib::GmmGen8TextureCalc::Fill2DTexOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t i;

    GMM_DPF_ENTER;

    // QPitch: Array Element-to-Element, or Cube Face-to-Face Pitch...
    if((pTexInfo->ArraySize <= 1) &&
       (pTexInfo->Type != RESOURCE_CUBE) &&
       !(pTexInfo->Flags.Gpu.ColorSeparation ||
         pTexInfo->Flags.Gpu.ColorSeparationRGBX))
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender = 0;
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock   = 0;
    }
    else
    {
        uint32_t ArrayQPitch;
        uint32_t CompressHeight, CompressWidth, CompressDepth;

        GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

        ArrayQPitch = pTexInfo->Alignment.QPitch;

        if(GmmIsCompressed(pGmmLibContext, pTexInfo->Format))
        {
            ArrayQPitch /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            ArrayQPitch /= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS)
        {
            if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
            {
                ArrayQPitch /= 32;
            }
            else if(pTexInfo->Flags.Gpu.__NonMsaaTileXCcs)
            {
                ArrayQPitch /= 16;
            }
        }

        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender = ArrayQPitch * pTexInfo->Pitch;
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock   = ArrayQPitch * pTexInfo->Pitch;
    }

    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[i] = Get2DTexOffsetAddressPerMip(pTexInfo, i);
    }

    GMM_DPF_EXIT;
}